

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

int exr_set_screen_window_center(exr_context_t ctxt,int part_index,exr_attr_v2f_t *swc)

{
  exr_attribute_t **attr;
  pthread_mutex_t *__mutex;
  exr_priv_part_t p_Var1;
  exr_attribute_t *peVar2;
  exr_result_t eVar3;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  exr_context_t nonc;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar3 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar3;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar3 = 0x15;
  }
  else {
    if (ctxt->mode != '\0') {
      p_Var1 = ctxt->parts[(uint)part_index];
      attr = &p_Var1->screenWindowCenter;
      if (p_Var1->screenWindowCenter == (exr_attribute_t *)0x0) {
        eVar3 = exr_attr_list_add(ctxt,&p_Var1->attributes,"screenWindowCenter",EXR_ATTR_V2F,0,
                                  (uint8_t **)0x0,attr);
        if (eVar3 != 0) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return eVar3;
        }
      }
      else if (p_Var1->screenWindowCenter->type != EXR_ATTR_V2F) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        eVar3 = (*ctxt->print_error)
                          (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                           (*attr)->type_name,"screenWindowCenter",ctxt->print_error);
        return eVar3;
      }
      if (swc != (exr_attr_v2f_t *)0x0) {
        peVar2 = *attr;
        (((peVar2->field_6).box2i)->min).x = (int32_t)swc->x;
        (((peVar2->field_6).box2i)->min).y = (int32_t)swc->y;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return 0;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar3 = (*ctxt->report_error)(ctxt,3,"Missing value for data window assignment");
      return eVar3;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar3 = 8;
  }
  eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar3);
  return eVar3;
}

Assistant:

exr_result_t
exr_set_screen_window_center (
    exr_context_t ctxt, int part_index, const exr_attr_v2f_t* swc)
{
    REQ_ATTR_FIND_CREATE (screenWindowCenter, EXR_ATTR_V2F);
    if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN (rv);
    if (!swc)
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Missing value for data window assignment"));

    attr->v2f->x = swc->x;
    attr->v2f->y = swc->y;
    return EXR_UNLOCK_AND_RETURN (rv);
}